

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByCamelcaseName(Descriptor *this,string *key)

{
  FileDescriptorTables *pFVar1;
  second_type pFVar2;
  FieldDescriptor *pFVar3;
  FileDescriptorTables *local_20;
  
  pFVar1 = *(FileDescriptorTables **)(*(long *)(this + 0x10) + 0x90);
  local_20 = pFVar1;
  std::
  call_once<void(&)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
            (&pFVar1->fields_by_camelcase_name_once_,
             FileDescriptorTables::FieldsByCamelcaseNamesLazyInitStatic,&local_20);
  pFVar2 = FindPtrOrNull<std::unordered_map<std::pair<void_const*,char_const*>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual,std::allocator<std::pair<std::pair<void_const*,char_const*>const,google::protobuf::FieldDescriptor_const*>>>>
                     ((unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)(pFVar1->fields_by_camelcase_name_)._M_h._M_buckets,
                      (first_type *)(pFVar1->fields_by_camelcase_name_)._M_h._M_bucket_count);
  if (pFVar2 == (second_type)0x0) {
    pFVar3 = (FieldDescriptor *)0x0;
  }
  else {
    pFVar3 = (FieldDescriptor *)0x0;
    if (pFVar2[0x42] != (FieldDescriptor)0x0) {
      pFVar3 = pFVar2;
    }
  }
  return pFVar3;
}

Assistant:

const FieldDescriptor* Descriptor::FindExtensionByCamelcaseName(
    const std::string& key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByCamelcaseName(this, key);
  if (result == nullptr || !result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}